

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPart.c
# Opt level: O3

Aig_Man_t *
Aig_ManFraigPartitioned(Aig_Man_t *pAig,int nPartSize,int nConfMax,int nLevelMax,int fVerbose)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  void **ppvVar6;
  void **ppvVar7;
  void *pvVar8;
  int iVar9;
  Vec_Ptr_t *__ptr;
  Aig_Man_t *pAVar10;
  void *pvVar11;
  Aig_Man_t *p;
  Vec_Ptr_t *pVVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  
  __ptr = Aig_ManPartitionNaive(pAig,nPartSize);
  Aig_ManReprStart(pAig,pAig->vObjs->nSize);
  Aig_ManSetCioIds(pAig);
  uVar1 = __ptr->nSize;
  lVar15 = (long)(int)uVar1;
  if (0 < lVar15) {
    ppvVar6 = __ptr->pArray;
    lVar16 = 0;
    do {
      pAVar10 = Aig_ManDupPartAll(pAig,(Vec_Int_t *)ppvVar6[lVar16]);
      pVVar12 = pAVar10->vObjs;
      lVar14 = (long)pVVar12->nSize;
      pvVar11 = malloc(lVar14 * 8);
      if (0 < lVar14) {
        ppvVar7 = pVVar12->pArray;
        lVar13 = 0;
        do {
          pvVar8 = ppvVar7[lVar13];
          if (pvVar8 != (void *)0x0) {
            *(undefined8 *)((long)pvVar11 + lVar13 * 8) = *(undefined8 *)((long)pvVar8 + 0x28);
          }
          lVar13 = lVar13 + 1;
        } while (lVar14 != lVar13);
      }
      if (fVerbose != 0) {
        uVar2 = pAVar10->nObjs[2];
        uVar3 = pAVar10->nObjs[3];
        iVar4 = pAVar10->nObjs[6];
        iVar5 = pAVar10->nObjs[5];
        iVar9 = Aig_ManLevelNum(pAVar10);
        printf("Part %4d  (out of %4d)  PI = %5d. PO = %5d. And = %6d. Lev = %4d.\r",
               (ulong)((int)lVar16 + 1),(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,
               (ulong)(uint)(iVar4 + iVar5),iVar9);
      }
      p = Fra_FraigChoice(pAVar10,nConfMax,nLevelMax);
      Aig_ManStop(p);
      pVVar12 = pAVar10->vObjs;
      if (0 < pVVar12->nSize) {
        lVar14 = 0;
        do {
          if (pVVar12->pArray[lVar14] != (void *)0x0) {
            *(undefined8 *)((long)pVVar12->pArray[lVar14] + 0x28) =
                 *(undefined8 *)((long)pvVar11 + lVar14 * 8);
            pVVar12 = pAVar10->vObjs;
          }
          lVar14 = lVar14 + 1;
        } while (lVar14 < pVVar12->nSize);
      }
      if (pvVar11 != (void *)0x0) {
        free(pvVar11);
      }
      if (pAVar10->pReprs != (Aig_Obj_t **)0x0) {
        Aig_ManTransferRepr(pAig,pAVar10);
      }
      Aig_ManStop(pAVar10);
      lVar16 = lVar16 + 1;
    } while (lVar16 != lVar15);
  }
  if (fVerbose != 0) {
    printf(
          "                                                                                          \r"
          );
  }
  ppvVar6 = __ptr->pArray;
  if ((int)uVar1 < 1) {
    if (ppvVar6 == (void **)0x0) goto LAB_006cef74;
  }
  else {
    lVar16 = 0;
    do {
      pvVar11 = ppvVar6[lVar16];
      if (pvVar11 != (void *)0x0) {
        if (*(void **)((long)pvVar11 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar11 + 8));
        }
        free(pvVar11);
      }
      lVar16 = lVar16 + 1;
    } while (lVar15 != lVar16);
  }
  free(ppvVar6);
LAB_006cef74:
  free(__ptr);
  Aig_ManCleanCioIds(pAig);
  pAVar10 = Aig_ManDupRepr(pAig,0);
  return pAVar10;
}

Assistant:

Aig_Man_t * Aig_ManFraigPartitioned( Aig_Man_t * pAig, int nPartSize, int nConfMax, int nLevelMax, int fVerbose )
{
//    extern Aig_Man_t * Fra_FraigChoice( Aig_Man_t * pManAig, int nConfMax, int nLevelMax );

    Aig_Man_t * pAigPart, * pAigTemp;
    Vec_Int_t * vPart;
    Vec_Ptr_t * vParts;
    Aig_Obj_t * pObj;
    void ** ppData;
    int i, k;

    // partition the outputs of the AIG
    vParts = Aig_ManPartitionNaive( pAig, nPartSize );

    // start the equivalence classes
    Aig_ManReprStart( pAig, Aig_ManObjNumMax(pAig) );

    // set the PI numbers
    Aig_ManSetCioIds( pAig );

    // create the total fraiged AIG
    Vec_PtrForEachEntry( Vec_Int_t *, vParts, vPart, i )
    {
        // derive the partition AIG
        pAigPart = Aig_ManDupPartAll( pAig, vPart );
        // store contents of pData pointers
        ppData = ABC_ALLOC( void *, Aig_ManObjNumMax(pAigPart) );
        Aig_ManForEachObj( pAigPart, pObj, k )
            ppData[k] = pObj->pData;
        // report the process
        if ( fVerbose )
        printf( "Part %4d  (out of %4d)  PI = %5d. PO = %5d. And = %6d. Lev = %4d.\r", 
            i+1, Vec_PtrSize(vParts), Aig_ManCiNum(pAigPart), Aig_ManCoNum(pAigPart), 
            Aig_ManNodeNum(pAigPart), Aig_ManLevelNum(pAigPart) );
        // compute equivalence classes (to be stored in pNew->pReprs)
        pAigTemp = Fra_FraigChoice( pAigPart, nConfMax, nLevelMax );
        Aig_ManStop( pAigTemp );
        // reset the pData pointers
        Aig_ManForEachObj( pAigPart, pObj, k )
            pObj->pData = ppData[k];
        ABC_FREE( ppData );
        // transfer representatives to the total AIG
        if ( pAigPart->pReprs )
            Aig_ManTransferRepr( pAig, pAigPart );
        Aig_ManStop( pAigPart );
    }
    if ( fVerbose )
    printf( "                                                                                          \r" );
    Vec_VecFree( (Vec_Vec_t *)vParts );

    // clear the PI numbers
    Aig_ManCleanCioIds( pAig );

    // derive the result of choicing
    return Aig_ManDupRepr( pAig, 0 );
}